

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtCore.c
# Opt level: O2

Vec_Vec_t *
Cgt_ClockGatingCandidates(Aig_Man_t *pAig,Aig_Man_t *pCare,Cgt_Par_t *pPars,Vec_Int_t *vUseful)

{
  Vec_Vec_t *pVVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  Cgt_Man_t *p;
  Aig_Man_t *pAVar5;
  abctime aVar6;
  Bar_Progress_t *p_00;
  Cgt_Par_t local_58;
  
  aVar3 = Abc_Clock();
  aVar4 = Abc_Clock();
  Aig_ManRandom(1);
  if (pPars == (Cgt_Par_t *)0x0) {
    local_58.fVeryVerbose = 0;
    local_58.nLevelMax = 0x19;
    local_58.nCandMax = 1000;
    local_58.nOdcMax = 0;
    local_58.nConfMax = 10;
    local_58.nVarsMin = 1000;
    local_58.nFlopsMin = 10;
    local_58.fAreaOnly = 0;
    local_58.fVerbose = 0;
    pPars = &local_58;
  }
  p = Cgt_ManCreate(pAig,pCare,pPars);
  p->vUseful = vUseful;
  pAVar5 = Cgt_ManDeriveAigForGating(p);
  p->pFrame = pAVar5;
  aVar6 = Abc_Clock();
  p->timeAig = p->timeAig + (aVar6 - aVar3);
  iVar2 = p->pFrame->nObjs[3];
  if (iVar2 == p->pAig->nRegs) {
    p_00 = Bar_ProgressStart(_stdout,iVar2);
    for (iVar2 = 0; iVar2 < p->pFrame->nObjs[3]; iVar2 = Cgt_ClockGatingRange(p,iVar2)) {
      if ((p_00 == (Bar_Progress_t *)0x0) || (p_00->nItemsNext <= iVar2)) {
        Bar_ProgressUpdate_int(p_00,iVar2,(char *)0x0);
      }
    }
    Bar_ProgressStop(p_00);
    pVVar1 = p->vGatesAll;
    p->vGatesAll = (Vec_Vec_t *)0x0;
    aVar3 = Abc_Clock();
    p->timeTotal = aVar3 - aVar4;
    Cgt_ManStop(p);
    return pVVar1;
  }
  __assert_fail("Aig_ManCoNum(p->pFrame) == Saig_ManRegNum(p->pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cgt/cgtCore.c"
                ,0x105,
                "Vec_Vec_t *Cgt_ClockGatingCandidates(Aig_Man_t *, Aig_Man_t *, Cgt_Par_t *, Vec_Int_t *)"
               );
}

Assistant:

Vec_Vec_t * Cgt_ClockGatingCandidates( Aig_Man_t * pAig, Aig_Man_t * pCare, Cgt_Par_t * pPars, Vec_Int_t * vUseful )
{
    Bar_Progress_t * pProgress = NULL;
    Cgt_Par_t Pars; 
    Cgt_Man_t * p;
    Vec_Vec_t * vGatesAll;
    int iStart;
    abctime clk = Abc_Clock(), clkTotal = Abc_Clock();
    // reset random numbers
    Aig_ManRandom( 1 );
    if ( pPars == NULL )
        Cgt_SetDefaultParams( pPars = &Pars );    
    p = Cgt_ManCreate( pAig, pCare, pPars );
    p->vUseful = vUseful;
    p->pFrame = Cgt_ManDeriveAigForGating( p );
p->timeAig += Abc_Clock() - clk;
    assert( Aig_ManCoNum(p->pFrame) == Saig_ManRegNum(p->pAig) );
    pProgress = Bar_ProgressStart( stdout, Aig_ManCoNum(p->pFrame) );
    for ( iStart = 0; iStart < Aig_ManCoNum(p->pFrame); )
    {
        Bar_ProgressUpdate( pProgress, iStart, NULL );
        iStart = Cgt_ClockGatingRange( p, iStart );
    }
    Bar_ProgressStop( pProgress );
    vGatesAll = p->vGatesAll;
    p->vGatesAll = NULL;
p->timeTotal = Abc_Clock() - clkTotal;
    Cgt_ManStop( p );
    return vGatesAll;
}